

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdUVTexture *shader,uint32_t indent)

{
  undefined8 uVar1;
  uint32_t indent_00;
  uint32_t in_R8D;
  stringstream ss;
  allocator local_201;
  string local_200;
  undefined1 local_1e0 [56];
  ostream local_1a8 [376];
  
  local_1e0._32_8_ = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(local_1e0 + 0x28));
  ::std::__cxx11::string::string((string *)local_1e0,"inputs:file",&local_201);
  indent_00 = (uint32_t)shader;
  print_typed_attr<tinyusdz::value::AssetPath>
            (&local_200,
             (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)(this + 0x730),
             (string *)local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"inputs:sourceColorSpace",&local_201);
  print_typed_token_attr<tinyusdz::UsdUVTexture::SourceColorSpace>
            (&local_200,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
              *)(this + 0x13c8),(string *)local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"inputs:fallback",&local_201);
  print_typed_attr<tinyusdz::value::color4f>
            (&local_200,(TypedAttributeWithFallback<tinyusdz::value::color4f> *)(this + 0x1178),
             (string *)local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"inputs:bias",&local_201);
  print_typed_attr<std::array<float,4ul>>
            (&local_200,this + 0x18a0,
             (TypedAttributeWithFallback<std::array<float,_4UL>_> *)local_1e0,
             (string *)((ulong)shader & 0xffffffff),in_R8D);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"inputs:scale",&local_201);
  print_typed_attr<std::array<float,4ul>>
            (&local_200,this + 0x1650,
             (TypedAttributeWithFallback<std::array<float,_4UL>_> *)local_1e0,
             (string *)((ulong)shader & 0xffffffff),in_R8D);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"inputs:st",&local_201);
  print_typed_attr<tinyusdz::value::texcoord2f>
            (&local_200,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::texcoord2f>_> *)
             (this + 0x9d0),(string *)local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"inputs:wrapT",&local_201);
  print_typed_token_attr<tinyusdz::UsdUVTexture::Wrap>
            (&local_200,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *)
             (this + 0xc68),(string *)local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"inputs:wrapS",&local_201);
  print_typed_token_attr<tinyusdz::UsdUVTexture::Wrap>
            (&local_200,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *)
             (this + 0xef0),(string *)local_1e0,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"outputs:r",&local_201);
  print_typed_terminal_attr<float>
            (&local_200,(TypedTerminalAttribute<float> *)(this + 0x1af0),(string *)local_1e0,
             indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"outputs:g",&local_201);
  print_typed_terminal_attr<float>
            (&local_200,(TypedTerminalAttribute<float> *)(this + 0x1d20),(string *)local_1e0,
             indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"outputs:b",&local_201);
  print_typed_terminal_attr<float>
            (&local_200,(TypedTerminalAttribute<float> *)(this + 0x1f50),(string *)local_1e0,
             indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"outputs:a",&local_201);
  print_typed_terminal_attr<float>
            (&local_200,(TypedTerminalAttribute<float> *)(this + 0x2180),(string *)local_1e0,
             indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e0,"outputs:rgb",&local_201);
  print_typed_terminal_attr<std::array<float,3ul>>
            (&local_200,this + 0x23b0,(TypedTerminalAttribute<std::array<float,_3UL>_> *)local_1e0,
             (string *)((ulong)shader & 0xffffffff),in_R8D);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  print_common_shader_params_abi_cxx11_
            (&local_200,this,(ShaderNode *)((ulong)shader & 0xffffffff),indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  uVar1 = local_1e0._32_8_;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e0 + 0x28));
  return (string *)(anon_struct_8_0_00000001_for___align)uVar1;
}

Assistant:

static std::string print_shader_params(const UsdUVTexture &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_typed_attr(shader.file, "inputs:file", indent);

  ss << print_typed_token_attr(shader.sourceColorSpace,
                               "inputs:sourceColorSpace", indent);

  ss << print_typed_attr(shader.fallback, "inputs:fallback", indent);

  ss << print_typed_attr(shader.bias, "inputs:bias", indent);
  ss << print_typed_attr(shader.scale, "inputs:scale", indent);

  ss << print_typed_attr(shader.st, "inputs:st", indent);
  ss << print_typed_token_attr(shader.wrapS, "inputs:wrapT", indent);
  ss << print_typed_token_attr(shader.wrapT, "inputs:wrapS", indent);

  ss << print_typed_terminal_attr(shader.outputsR, "outputs:r", indent);
  ss << print_typed_terminal_attr(shader.outputsG, "outputs:g", indent);
  ss << print_typed_terminal_attr(shader.outputsB, "outputs:b", indent);
  ss << print_typed_terminal_attr(shader.outputsA, "outputs:a", indent);
  ss << print_typed_terminal_attr(shader.outputsRGB, "outputs:rgb", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}